

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLTextureBuffer::GLTextureBuffer
          (GLTextureBuffer *this,TextureFormat format_,uint size1D,float *data)

{
  ulong uVar1;
  runtime_error *this_00;
  
  TextureBuffer::TextureBuffer(&this->super_TextureBuffer,1,format_,size1D,0xffffffff);
  (this->super_TextureBuffer)._vptr_TextureBuffer = (_func_int **)&PTR__GLTextureBuffer_004b7f50;
  (*glad_glGenTextures)(1,&this->handle);
  (*glad_glBindTexture)(0xde0,this->handle);
  uVar1 = (ulong)(this->super_TextureBuffer).format;
  if (uVar1 < 10) {
    (*glad_glTexImage1D)
              (0xde0,0,*(GLint *)(&DAT_00412068 + uVar1 * 4),size1D,0,
               *(GLenum *)(&DAT_004120b8 + uVar1 * 4),0x1406,data);
    checkGLError(true);
    (*(this->super_TextureBuffer)._vptr_TextureBuffer[4])(this,0);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"bad enum");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GLTextureBuffer::GLTextureBuffer(TextureFormat format_, unsigned int size1D, float* data)
    : TextureBuffer(1, format_, size1D) {

  glGenTextures(1, &handle);
  glBindTexture(GL_TEXTURE_1D, handle);
  glTexImage1D(GL_TEXTURE_1D, 0, internalFormat(format), size1D, 0, formatF(format), GL_FLOAT, data);
  checkGLError();

  setFilterMode(FilterMode::Nearest);
}